

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O3

HighsStatus calculateColDualsQuad(HighsLp *lp,HighsSolution *solution)

{
  pointer pHVar1;
  double *pdVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  int *piVar6;
  pointer piVar7;
  pointer pdVar8;
  bool bVar9;
  HighsStatus HVar10;
  int iVar11;
  size_type __new_size;
  size_type sVar12;
  size_type sVar13;
  long lVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> col_dual_quad;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_68;
  value_type local_48;
  
  pdVar4 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar11 = lp->num_row_;
  bVar9 = HighsSparseMatrix::isColwise(&lp->a_matrix_);
  HVar10 = kError;
  if ((bVar9) && (iVar11 == (int)((ulong)((long)pdVar4 - (long)pdVar5) >> 3))) {
    local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.hi = 0.0;
    local_48.lo = 0.0;
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::_M_fill_assign
              (&local_68,(long)lp->num_col_,&local_48);
    __new_size = (size_type)lp->num_col_;
    if (0 < (long)__new_size) {
      pdVar4 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar7 = (lp->a_matrix_).index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (solution->row_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (lp->a_matrix_).value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar12 = 0;
      iVar11 = *piVar6;
      do {
        iVar3 = piVar6[sVar12 + 1];
        pHVar1 = local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start + sVar12;
        if (iVar11 < iVar3) {
          dVar15 = pHVar1->lo;
          lVar14 = (long)iVar11;
          dVar17 = pHVar1->hi;
          do {
            dVar18 = pdVar5[piVar7[lVar14]] * pdVar8[lVar14];
            dVar16 = dVar18 + dVar17;
            pHVar1->hi = dVar16;
            dVar15 = dVar15 + (dVar17 - (dVar16 - dVar18)) + (dVar18 - (dVar16 - (dVar16 - dVar18)))
            ;
            pHVar1->lo = dVar15;
            lVar14 = lVar14 + 1;
            dVar17 = dVar16;
          } while (iVar3 != lVar14);
        }
        else {
          dVar16 = pHVar1->hi;
          dVar15 = pHVar1->lo;
        }
        dVar17 = pdVar4[sVar12];
        sVar13 = sVar12 + 1;
        dVar18 = dVar17 + dVar16;
        local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start[sVar12].hi = dVar18;
        local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start[sVar12].lo =
             (dVar16 - (dVar18 - dVar17)) + (dVar17 - (dVar18 - (dVar18 - dVar17))) + dVar15;
        sVar12 = sVar13;
        iVar11 = iVar3;
      } while (sVar13 != __new_size);
    }
    std::vector<double,_std::allocator<double>_>::resize(&solution->col_dual,__new_size);
    if (local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pdVar4 = (solution->col_dual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar14 = 0;
      do {
        pdVar2 = (double *)
                 ((long)&(local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                          _M_impl.super__Vector_impl_data._M_start)->hi + lVar14 * 2);
        *(double *)((long)pdVar4 + lVar14) = *pdVar2 + pdVar2[1];
        lVar14 = lVar14 + 8;
      } while ((pointer)(pdVar2 + 2) !=
               local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    HVar10 = kOk;
  }
  return HVar10;
}

Assistant:

HighsStatus calculateColDualsQuad(const HighsLp& lp, HighsSolution& solution) {
  const bool correct_size = int(solution.row_dual.size()) == lp.num_row_;
  const bool is_colwise = lp.a_matrix_.isColwise();
  const bool data_error = !correct_size || !is_colwise;
  assert(!data_error);
  if (data_error) return HighsStatus::kError;

  std::vector<HighsCDouble> col_dual_quad;
  col_dual_quad.assign(lp.num_col_, HighsCDouble{0.0});

  for (HighsInt col = 0; col < lp.num_col_; col++) {
    for (HighsInt i = lp.a_matrix_.start_[col];
         i < lp.a_matrix_.start_[col + 1]; i++) {
      const HighsInt row = lp.a_matrix_.index_[i];
      assert(row >= 0);
      assert(row < lp.num_row_);
      col_dual_quad[col] += solution.row_dual[row] * lp.a_matrix_.value_[i];
    }
    col_dual_quad[col] += lp.col_cost_[col];
  }

  // assign quad values to double vector
  solution.col_dual.resize(lp.num_col_);
  std::transform(col_dual_quad.begin(), col_dual_quad.end(),
                 solution.col_dual.begin(),
                 [](HighsCDouble x) { return double(x); });

  return HighsStatus::kOk;
}